

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall
libwebm::VpxPesParser::FindStartCode(VpxPesParser *this,size_t origin,size_t *offset)

{
  long lVar1;
  const_reference pvVar2;
  ulong local_40;
  size_t i;
  uint8_t *data;
  size_t length;
  size_t *offset_local;
  size_t origin_local;
  VpxPesParser *this_local;
  
  if ((*(long *)(this + 0x70) + 2U < *(ulong *)(this + 0x38)) &&
     (lVar1 = *(long *)(this + 0x38), 2 < lVar1 - origin)) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                        origin);
    for (local_40 = 0; local_40 < (lVar1 - origin) - 3; local_40 = local_40 + 1) {
      if (((pvVar2[local_40] == '\0') && (pvVar2[local_40 + 1] == '\0')) &&
         (pvVar2[local_40 + 2] == '\x01')) {
        *offset = origin + local_40;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool VpxPesParser::FindStartCode(std::size_t origin,
                                 std::size_t* offset) const {
  if (read_pos_ + 2 >= pes_file_size_)
    return false;

  const std::size_t length = pes_file_size_ - origin;
  if (length < 3)
    return false;

  const uint8_t* const data = &pes_file_data_[origin];
  for (std::size_t i = 0; i < length - 3; ++i) {
    if (data[i] == 0 && data[i + 1] == 0 && data[i + 2] == 1) {
      *offset = origin + i;
      return true;
    }
  }

  return false;
}